

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::GetFilledEpochs
          (EpochTracker *this,float unvoiced_pm_interval,
          vector<float,_std::allocator<float>_> *times,
          vector<short,_std::allocator<short>_> *voicing)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  value_type_conflict1 *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float now;
  int32_t fill_ind;
  float next_time;
  float time;
  int32_t i_old;
  int32_t i;
  int32_t limit;
  float final_time;
  float fVar7;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  float in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float local_34;
  int local_2c;
  
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x12377c);
  std::vector<short,_std::allocator<short>_>::clear
            ((vector<short,_std::allocator<short>_> *)0x123786);
  sVar3 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x34));
  fVar6 = (float)(long)sVar3;
  fVar7 = (float)sVar3;
  fVar5 = fVar7 / *(float *)(in_RDI + 0x94);
  sVar3 = std::
          vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
          ::size((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                  *)(in_RDI + 0x10));
  iVar2 = (int)sVar3 + -1;
  local_2c = iVar2;
  while (iVar1 = local_2c, -1 < local_2c) {
    pvVar4 = std::
             vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           *)(in_RDI + 0x10),(long)local_2c);
    local_34 = (float)pvVar4->resid_index / *(float *)(in_RDI + 0x94);
    pvVar4 = std::
             vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           *)(in_RDI + 0x10),(long)local_2c);
    if (((pvVar4->voiced & 1U) != 0) ||
       ((local_2c < iVar2 &&
        (pvVar4 = std::
                  vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                *)(in_RDI + 0x10),(long)(local_2c + 1)), (pvVar4->voiced & 1U) != 0)
        ))) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffffbc,
                          CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)));
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)CONCAT44(fVar7,fVar6),in_RDI);
      local_2c = local_2c + -1;
    }
    if (local_2c == iVar2) {
      local_34 = 0.0;
    }
    if (((0 < local_2c) &&
        (pvVar4 = std::
                  vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                *)(in_RDI + 0x10),(long)local_2c), (pvVar4->voiced & 1U) == 0)) &&
       (local_34 < fVar5)) {
      while ((0 < local_2c &&
             (pvVar4 = std::
                       vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                       ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                     *)(in_RDI + 0x10),(long)local_2c), (pvVar4->voiced & 1U) == 0))
            ) {
        local_2c = local_2c + -1;
      }
      in_stack_ffffffffffffffc0 = 1;
      in_stack_ffffffffffffffc4 = fVar5;
      if (0 < local_2c) {
        pvVar4 = std::
                 vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                               *)(in_RDI + 0x10),(long)local_2c);
        in_stack_ffffffffffffffc4 =
             (float)pvVar4->resid_index / *(float *)(in_RDI + 0x94) -
             1.0 / *(float *)(in_RDI + 0xb6);
      }
      for (; in_stack_ffffffffffffffbc = (float)in_stack_ffffffffffffffc0 * in_XMM0_Da + local_34,
          in_stack_ffffffffffffffbc < in_stack_ffffffffffffffc4;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_ffffffffffffffbc,
                            CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)));
        in_stack_ffffffffffffffba = 0;
        std::vector<short,_std::allocator<short>_>::push_back
                  ((vector<short,_std::allocator<short>_> *)CONCAT44(fVar7,fVar6),in_RDI);
      }
    }
    if (local_2c == iVar1) {
      local_2c = local_2c + -1;
    }
  }
  return;
}

Assistant:

void EpochTracker::GetFilledEpochs(float unvoiced_pm_interval,
                                   std::vector<float>* times,
                                   std::vector<int16_t>* voicing) {
  times->clear();
  voicing->clear();
  float final_time = norm_residual_.size() / sample_rate_;
  int32_t limit = output_.size() - 1;
  int32_t i = limit;
  // Produce the output in normal time order.
  while (i >= 0) {
    int32_t i_old = i;
    float time = output_[i].resid_index / sample_rate_;
    // Note that the pulse locations of both the beginning and end
    // of any voiced period are of interest.
    if (output_[i].voiced || ((i < limit) && (output_[i+1].voiced))) {
      times->push_back(time);
      voicing->push_back(1);
      i--;
    }
    if (i == limit) {
      time = 0.0;
    }
    if ((i > 0) && (!output_[i].voiced) && (time < final_time)) {
      for ( ; i > 0; --i) {
        if (output_[i].voiced) {
          break;
        }
      }
      float next_time = final_time;
      int32_t fill_ind = 1;
      if (i > 0) {
        next_time = (output_[i].resid_index / sample_rate_) -
            (1.0 / max_f0_search_);
      }
      float now = time + (fill_ind * unvoiced_pm_interval);
      while (now < next_time) {
        times->push_back(now);
        voicing->push_back(0);
        fill_ind++;
        now = time + (fill_ind * unvoiced_pm_interval);
      }
    }
    if (i == i_old) {
      i--;
    }
  }
}